

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O3

void Psr_ManRemapBoxes(Bac_Man_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  char *pStr;
  uint uVar5;
  long lVar6;
  Psr_Ntk_t *pNtkBox;
  
  if (0 < (pNtk->vObjs).nSize) {
    lVar6 = 0;
    do {
      piVar2 = (pNtk->vObjs).pArray;
      iVar1 = piVar2[lVar6];
      if (((long)iVar1 < 0) || (uVar4 = (pNtk->vBoxes).nSize, (int)uVar4 <= iVar1)) {
LAB_0038ed74:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar3[iVar1] + -2;
      iVar1 = piVar2[lVar6];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if (((long)iVar1 < -3) || (uVar4 <= iVar1 + 3U)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Psr_BoxSignals_V._8_8_ = piVar3 + (iVar1 + 3U);
      if ((pNtk->vObjs).nSize <= lVar6) goto LAB_0038ed74;
      if (*(int *)Psr_BoxSignals_V._8_8_ != 0) {
        if (iVar1 < -1) goto LAB_0038ed74;
        pStr = Abc_NamStr(pNtk->pStrs,piVar3[(long)iVar1 + 1]);
        uVar4 = Abc_NamStrFind(pNew->pMods,pStr);
        if ((int)uVar4 < 1) {
          __assert_fail("NtkIdNew > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                        ,0x88,
                        "void Psr_ManRemapBoxes(Bac_Man_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *)"
                       );
        }
        if ((pNtk->vObjs).nSize <= lVar6) goto LAB_0038ed74;
        iVar1 = (pNtk->vObjs).pArray[lVar6];
        if ((iVar1 < -1) || (uVar5 = iVar1 + 1, (pNtk->vBoxes).nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pNtk->vBoxes).pArray[uVar5] = uVar4;
        if ((int)uVar4 <= pNew->nNtks) {
          if (vDes->nSize < (int)uVar4) {
            pNtkBox = (Psr_Ntk_t *)0x0;
          }
          else {
            pNtkBox = (Psr_Ntk_t *)vDes->pArray[(ulong)uVar4 - 1];
          }
          Psr_ManRemapOne((Vec_Int_t *)Psr_BoxSignals_V,pNtkBox,vMap);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pNtk->vObjs).nSize);
  }
  return;
}

Assistant:

void Psr_ManRemapBoxes( Bac_Man_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; int iBox;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            int NtkIdNew = Bac_ManNtkFindId( pNew, Psr_NtkStr(pNtk, NtkId) );
            assert( NtkIdNew > 0 );
            Psr_BoxSetNtk( pNtk, iBox, NtkIdNew );
            if ( NtkIdNew <= Bac_ManNtkNum(pNew) )
                Psr_ManRemapOne( vSigs, Psr_ManNtk(vDes, NtkIdNew-1), vMap );
            //else
            //    Psr_ManRemapGate( vSigs );
        }
}